

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::TextureFilterMinmaxFilteringTestCaseBase::iterate
          (TextureFilterMinmaxFilteringTestCaseBase *this)

{
  float fVar1;
  uint uVar2;
  SupportedTextureType *this_00;
  int i_1;
  int iVar3;
  deUint32 err;
  GLuint GVar4;
  undefined4 extraout_var;
  mapped_type *pmVar6;
  TestError *this_01;
  int i;
  long lVar7;
  SupportedTextureType *this_02;
  pointer __k;
  pointer pSVar8;
  GLuint resultTextureId;
  IVec2 scaledTextureSize;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  reductionModeTexelSumMap;
  GLuint local_9c;
  key_type_conflict local_98;
  int iStack_94;
  pointer local_90;
  RenderContext *local_88;
  IVec2 local_80;
  IVec2 local_78;
  _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  local_70;
  undefined4 local_3c [3];
  long lVar5;
  
  local_88 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar3 = (*local_88->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_90 = (this->m_utils).m_supportedTextureTypes.
             super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (local_90 ==
        (this->m_utils).m_supportedTextureTypes.
        super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    pSVar8 = (this->m_utils).m_supportedTextureDataTypes.
             super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar8 != (this->m_utils).m_supportedTextureDataTypes.
                  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = *local_90;
      do {
        uVar2 = pSVar8->m_testFlags;
        if ((((uVar2 & 1) != 0) && (((uVar2 & 4) == 0 || (this_00->m_type != 0x806f)))) &&
           (((uVar2 & 8) == 0 || (this_00->m_type != 0x8513)))) {
          local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_70._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_70._M_impl.super__Rb_tree_header._M_header;
          local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_70._M_impl.super__Rb_tree_header._M_header._M_right =
               local_70._M_impl.super__Rb_tree_header._M_header._M_left;
          for (__k = (this->m_utils).m_reductionModeParams.
                     super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              __k != (this->m_utils).m_reductionModeParams.
                     super__Vector_base<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam,_std::allocator<gl4cts::TextureFilterMinmaxUtils::ReductionModeParam>_>
                     ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
            if (__k->m_queryTestOnly == false) {
              fVar1 = this->m_renderScale;
              lVar7 = 0;
              do {
                (&local_98)[lVar7] = (int)(fVar1 * 32.0);
                lVar7 = lVar7 + 1;
              } while (lVar7 == 1);
              lVar7 = 0;
              do {
                local_3c[lVar7] = 0x20;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 3);
              (*this_00->_vptr_SupportedTextureType[4])
                        (this_00,local_88,local_3c,(ulong)pSVar8->m_format,(ulong)pSVar8->m_type,
                         (ulong)this->m_mipmapping);
              local_9c = 0;
              (**(code **)(lVar5 + 0x6f8))(1,&local_9c);
              err = (**(code **)(lVar5 + 0x800))();
              glu::checkError(err,"glGenTextures() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                              ,0x2b0);
              local_78.m_data[1] = iStack_94;
              local_78.m_data[0] = local_98;
              this_02 = this_00;
              TextureFilterMinmaxUtils::SupportedTextureType::renderToFBO
                        (this_00,local_88,local_9c,&local_78,__k->m_reductionMode);
              local_80.m_data[1] = iStack_94;
              local_80.m_data[0] = local_98;
              GVar4 = TextureFilterMinmaxUtils::calcPixelSumValue
                                ((TextureFilterMinmaxUtils *)this_02,local_88,local_9c,&local_80,
                                 0x1903,0x1401);
              pmVar6 = std::
                       map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                       ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                     *)&local_70,&__k->m_reductionMode);
              *pmVar6 = GVar4;
              (**(code **)(lVar5 + 0x480))(1,&local_9c);
            }
          }
          local_98 = 0x8007;
          pmVar6 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                 *)&local_70,&local_98);
          uVar2 = *pmVar6;
          local_9c = 0x9367;
          pmVar6 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                 *)&local_70,(key_type_conflict *)&local_9c);
          if (*pmVar6 <= uVar2) {
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,
                       "Sum of texels for GL_MIN should be smaller than for GL_WEIGHTED_AVERAGE_ARB"
                       ,
                       "reductionModeTexelSumMap[GL_MIN] < reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB]"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                       ,699);
LAB_00a2be5c:
            __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          local_98 = 0x8008;
          pmVar6 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                 *)&local_70,&local_98);
          uVar2 = *pmVar6;
          local_9c = 0x9367;
          pmVar6 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[]((map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                                 *)&local_70,(key_type_conflict *)&local_9c);
          if (uVar2 <= *pmVar6) {
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,
                       "Sum of texels for GL_MAX should be greater than for GL_WEIGHTED_AVERAGE_ARB"
                       ,
                       "reductionModeTexelSumMap[GL_MAX] > reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB]"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                       ,0x2be);
            goto LAB_00a2be5c;
          }
          std::
          _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
          ::~_Rb_tree(&local_70);
        }
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != (this->m_utils).m_supportedTextureDataTypes.
                         super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureFilterMinmaxFilteringTestCaseBase::iterate()
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	const glw::Functions&	 gl			= renderContext.getFunctions();

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter textureTypeIter =
			 m_utils.getSupportedTextureTypes().begin();
		 textureTypeIter != m_utils.getSupportedTextureTypes().end(); ++textureTypeIter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *textureTypeIter;

		for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter dataTypeIter =
				 m_utils.getSupportedTextureDataTypes().begin();
			 dataTypeIter != m_utils.getSupportedTextureDataTypes().end(); ++dataTypeIter)
		{
			if (!dataTypeIter->hasFlag(TextureFilterMinmaxUtils::MINMAX))
				continue;

			if (dataTypeIter->hasFlag(TextureFilterMinmaxUtils::EXCLUDE_3D) && textureType->getType() == GL_TEXTURE_3D)
				continue;

			if (dataTypeIter->hasFlag(TextureFilterMinmaxUtils::EXCLUDE_CUBE) &&
				textureType->getType() == GL_TEXTURE_CUBE_MAP)
				continue;

			std::map<glw::GLint, glw::GLuint> reductionModeTexelSumMap;

			for (TextureFilterMinmaxUtils::ReductionModeParamIter paramIter = m_utils.getReductionModeParams().begin();
				 paramIter != m_utils.getReductionModeParams().end(); ++paramIter)
			{
				if (paramIter->m_queryTestOnly)
					continue;

				tcu::IVec2 scaledTextureSize(int(float(TEXTURE_FILTER_MINMAX_SIZE) * m_renderScale));

				textureType->generate(renderContext, tcu::IVec3(TEXTURE_FILTER_MINMAX_SIZE), dataTypeIter->m_format,
									  dataTypeIter->m_type, m_mipmapping);

				glw::GLuint resultTextureId = 0;
				gl.genTextures(1, &resultTextureId);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

				textureType->renderToFBO(renderContext, resultTextureId, scaledTextureSize, paramIter->m_reductionMode);

				reductionModeTexelSumMap[paramIter->m_reductionMode] = m_utils.calcPixelSumValue(
					renderContext, resultTextureId, scaledTextureSize, GL_RED, GL_UNSIGNED_BYTE);

				gl.deleteTextures(1, &resultTextureId);
			}

			TCU_CHECK_MSG(reductionModeTexelSumMap[GL_MIN] < reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB],
						  "Sum of texels for GL_MIN should be smaller than for GL_WEIGHTED_AVERAGE_ARB");

			TCU_CHECK_MSG(reductionModeTexelSumMap[GL_MAX] > reductionModeTexelSumMap[GL_WEIGHTED_AVERAGE_ARB],
						  "Sum of texels for GL_MAX should be greater than for GL_WEIGHTED_AVERAGE_ARB");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}